

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O1

FxExpression * __thiscall FxMinusSign::Resolve(FxMinusSign *this,FCompileContext *ctx)

{
  FxExpression *pFVar1;
  PString *pPVar2;
  PInt *pPVar3;
  PFloat *pPVar4;
  int iVar5;
  undefined4 extraout_var;
  FxMinusSign *this_00;
  TArray<FxJumpStatement_*,_FxJumpStatement_*> *other;
  ExpVal val;
  FString local_40;
  FxJumpStatement **local_38;
  undefined8 uStack_30;
  
  if ((this->super_FxExpression).isresolved == false) {
    (this->super_FxExpression).isresolved = true;
    if (this->Operand != (FxExpression *)0x0) {
      iVar5 = (*this->Operand->_vptr_FxExpression[2])();
      this->Operand = (FxExpression *)CONCAT44(extraout_var,iVar5);
    }
    pFVar1 = this->Operand;
    if (pFVar1 == (FxExpression *)0x0) {
      (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
      this = (FxMinusSign *)0x0;
    }
    else if ((pFVar1->ValueType == (PType *)TypeName) ||
            ((iVar5 = (**(code **)(*(long *)&pFVar1->ValueType->super_DObject + 0x90))(), iVar5 != 0
             && (iVar5 = (*(pFVar1->ValueType->super_DObject)._vptr_DObject[0x12])(), iVar5 != 1))))
    {
      FScriptPosition::Message(&(this->super_FxExpression).ScriptPosition,2,"Numeric type expected")
      ;
      (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
      this = (FxMinusSign *)0x0;
    }
    else {
      iVar5 = (*this->Operand->_vptr_FxExpression[3])();
      if ((char)iVar5 == '\0') {
        (this->super_FxExpression).ValueType = this->Operand->ValueType;
      }
      else {
        pPVar2 = (PString *)this->Operand[1]._vptr_FxExpression;
        other = &this->Operand[1].JumpAddresses;
        if (pPVar2 == TypeString) {
          FString::AttachToOther(&local_40,(FString *)other);
        }
        else {
          local_40.Chars = (char *)other->Array;
        }
        iVar5 = (*(pPVar2->super_PBasicType).super_PType.super_DObject._vptr_DObject[0x12])();
        if (iVar5 == 0) {
          this_00 = (FxMinusSign *)operator_new(0x48);
          iVar5 = (int)local_40.Chars;
          FxExpression::FxExpression
                    ((FxExpression *)this_00,&(this->super_FxExpression).ScriptPosition);
          (this_00->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxConstant_008682d0
          ;
          pPVar3 = TypeSInt32;
          this_00->Operand = (FxExpression *)TypeSInt32;
          (this_00->super_FxExpression).ValueType = (PType *)pPVar3;
          *(int *)&this_00[1].super_FxExpression._vptr_FxExpression = -iVar5;
        }
        else {
          this_00 = (FxMinusSign *)operator_new(0x48);
          local_38 = (FxJumpStatement **)local_40.Chars;
          uStack_30 = 0;
          FxExpression::FxExpression
                    ((FxExpression *)this_00,&(this->super_FxExpression).ScriptPosition);
          (this_00->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxConstant_008682d0
          ;
          this_00->Operand = (FxExpression *)TypeSInt32;
          *(undefined4 *)&this_00[1].super_FxExpression._vptr_FxExpression = 0;
          pPVar4 = TypeFloat64;
          this_00->Operand = (FxExpression *)TypeFloat64;
          (this_00->super_FxExpression).ValueType = (PType *)pPVar4;
          this_00[1].super_FxExpression._vptr_FxExpression =
               (_func_int **)((ulong)local_38 ^ 0x8000000000000000);
        }
        (this_00->super_FxExpression).isresolved = true;
        (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
        this = this_00;
        if (pPVar2 == TypeString) {
          FString::~FString(&local_40);
        }
      }
    }
  }
  return &this->super_FxExpression;
}

Assistant:

FxExpression *FxMinusSign::Resolve(FCompileContext& ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE(Operand, ctx);

	if (Operand->IsNumeric())
	{
		if (Operand->isConstant())
		{
			ExpVal val = static_cast<FxConstant *>(Operand)->GetValue();
			FxExpression *e = val.Type->GetRegType() == REGT_INT ?
				new FxConstant(-val.Int, ScriptPosition) :
				new FxConstant(-val.Float, ScriptPosition);
			delete this;
			return e;
		}
		ValueType = Operand->ValueType;
		return this;
	}
	else
	{
		ScriptPosition.Message(MSG_ERROR, "Numeric type expected");
		delete this;
		return NULL;
	}
}